

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O1

int __thiscall
CVmObjVector::gen_index_of
          (CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,int forward,
          int count_only)

{
  vm_val_t *v;
  bool bVar1;
  vm_datatype_t *pvVar2;
  vm_val_t *pvVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  ulong uVar6;
  char *buf;
  ulong uVar7;
  bool bVar8;
  vm_val_t ele;
  vm_val_t local_40;
  
  if (gen_index_of(unsigned_int,vm_val_t*,unsigned_int*,int,int)::desc == '\0') {
    gen_index_of();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,argc,&gen_index_of::desc);
  pvVar3 = sp_;
  if (iVar4 == 0) {
    v = sp_ + -1;
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_OBJ;
    (pvVar3->val).obj = self;
    retval->typ = VM_NIL;
    uVar6 = (ulong)*(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    vVar5 = 0;
    bVar8 = forward == 0;
    uVar7 = 0;
    if (bVar8) {
      uVar7 = uVar6;
    }
    do {
      if (forward == 0) {
        if (uVar7 != 0) goto LAB_002ca4c8;
LAB_002ca52e:
        bVar1 = false;
      }
      else {
        if (uVar6 <= uVar7) goto LAB_002ca52e;
LAB_002ca4c8:
        uVar7 = uVar7 - bVar8;
        buf = (this->super_CVmObjCollection).super_CVmObject.ext_ + uVar7 * 5 + 4;
        local_40.typ = (vm_datatype_t)*buf;
        vmb_get_dh_val(buf,&local_40);
        iVar4 = vm_val_t::equals(&local_40,v,0);
        if (iVar4 != 0) {
          if (count_only == 0) {
            retval->typ = VM_INT;
            (retval->val).obj = (int)uVar7 + 1;
            goto LAB_002ca52e;
          }
          vVar5 = vVar5 + 1;
        }
        uVar7 = uVar7 + !bVar8;
        bVar1 = true;
      }
    } while (bVar1);
    sp_ = sp_ + -2;
    if (count_only != 0) {
      retval->typ = VM_INT;
      (retval->val).obj = vVar5;
    }
  }
  return 1;
}

Assistant:

int CVmObjVector::gen_index_of(VMG_ vm_obj_id_t self, vm_val_t *retval,
                               uint *argc, int forward, int count_only)
{
    const vm_val_t *val;
    size_t cnt;
    size_t idx;
    int val_cnt;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the value, but leave it on the stack */
    val = G_stk->get(0);

    /* push a self-reference while working to protect from gc */
    G_interpreter->push_obj(vmg_ self);

    /* presume we won't find a matching element */
    retval->set_nil();
    val_cnt = 0;

    /* get the number of elements to visit */
    cnt = get_element_count();

    /* start at the first or last element, depending on the direction */
    idx = (forward ? 0 : cnt);

    /* scan the list, looking for the element */
    for (;;)
    {
        vm_val_t ele;

        /* if we've reached the last element, stop looking */
        if (forward ? idx >= cnt : idx == 0)
            break;

        /* if we're going backwards, move to the next element position */
        if (!forward)
            --idx;

        /* get this element */
        get_element(idx, &ele);

        /* if the element matches the search value, return its index */
        if (ele.equals(vmg_ val))
        {
            /* it matches - see what we're doing */
            if (count_only)
            {
                /* they only want the count */
                ++val_cnt;
            }
            else
            {
                /* this is the one - return its 1-based index */
                retval->set_int(idx + 1);
                
                /* foind it - no need to keep searching */
                break;
            }
        }

        /* if we're going forwards, move to the next element */
        if (forward)
            ++idx;
    }

    /* discard our gc protection (self) and our arguments */
    G_stk->discard(2);

    /* return the count if desired */
    if (count_only)
        retval->set_int(val_cnt);
    
    /* handled */
    return TRUE;
}